

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O0

void Imf_3_4::hufUncompress(char *compressed,int nCompressed,unsigned_short *raw,int nRaw)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int im_00;
  char *pcVar5;
  ulong uVar6;
  HufDec *hdecod;
  int in_ECX;
  int in_ESI;
  char *in_RDI;
  AutoArray<Imf_3_4::(anonymous_namespace)::HufDec,_16384> hdec;
  AutoArray<unsigned_long,_65537> freq;
  FastHufDecoder fhd;
  uint64_t nBytes;
  char *ptr;
  int nBits;
  int iM;
  int im;
  FastHufDecoder *in_stack_ffffffffffffab80;
  undefined4 in_stack_ffffffffffffab98;
  undefined4 in_stack_ffffffffffffab9c;
  undefined8 in_stack_ffffffffffffaba0;
  int iM_00;
  undefined8 in_stack_ffffffffffffaba8;
  HufDec *in_stack_ffffffffffffabb0;
  int in_stack_ffffffffffffabb8;
  AutoArray local_5428 [8];
  AutoArray local_5420 [8];
  uint local_5418;
  int in_stack_ffffffffffffabf4;
  int in_stack_ffffffffffffabf8;
  int in_stack_ffffffffffffabfc;
  char *in_stack_ffffffffffffac00;
  HufDec *in_stack_ffffffffffffac08;
  uint64_t *in_stack_ffffffffffffac10;
  undefined4 in_stack_ffffffffffffac20;
  int in_stack_ffffffffffffac24;
  unsigned_short *in_stack_ffffffffffffac28;
  int in_stack_ffffffffffffac34;
  uchar *in_stack_ffffffffffffac38;
  FastHufDecoder *in_stack_ffffffffffffac40;
  int in_stack_ffffffffffffb418;
  int in_stack_ffffffffffffb41c;
  int in_stack_ffffffffffffb420;
  int in_stack_ffffffffffffb424;
  char **in_stack_ffffffffffffb428;
  FastHufDecoder *in_stack_ffffffffffffb430;
  int local_30;
  int local_8;
  
  iM_00 = (int)((ulong)in_stack_ffffffffffffaba0 >> 0x20);
  if (in_ESI < 0x14) {
    if (in_ECX != 0) {
      anon_unknown_0::notEnoughData();
    }
  }
  else {
    uVar2 = anon_unknown_0::readUInt(in_RDI);
    uVar3 = anon_unknown_0::readUInt(in_RDI + 4);
    uVar4 = anon_unknown_0::readUInt(in_RDI + 0xc);
    if (((((int)uVar2 < 0) || (0x10000 < (int)uVar2)) || ((int)uVar3 < 0)) || (0x10000 < (int)uVar3)
       ) {
      anon_unknown_0::invalidTableSize();
    }
    pcVar5 = in_RDI + 0x14;
    uVar6 = (long)(int)uVar4 + 7U >> 3;
    if (in_RDI + in_ESI < pcVar5 + uVar6) {
      anon_unknown_0::notEnoughData();
    }
    else {
      bVar1 = FastHufDecoder::enabled();
      if ((bVar1) && (0x80 < (int)uVar4)) {
        FastHufDecoder::FastHufDecoder
                  (in_stack_ffffffffffffb430,in_stack_ffffffffffffb428,in_stack_ffffffffffffb424,
                   in_stack_ffffffffffffb420,in_stack_ffffffffffffb41c,in_stack_ffffffffffffb418);
        if (pcVar5 + (uVar6 - (long)in_RDI) <= (char *)(long)in_ESI) {
          FastHufDecoder::decode
                    (in_stack_ffffffffffffac40,in_stack_ffffffffffffac38,in_stack_ffffffffffffac34,
                     in_stack_ffffffffffffac28,in_stack_ffffffffffffac24);
        }
        else {
          anon_unknown_0::notEnoughData();
        }
        local_5418 = (uint)(pcVar5 + (uVar6 - (long)in_RDI) > (char *)(long)in_ESI);
        FastHufDecoder::~FastHufDecoder(in_stack_ffffffffffffab80);
      }
      else {
        AutoArray<unsigned_long,_65537>::AutoArray
                  ((AutoArray<unsigned_long,_65537> *)in_stack_ffffffffffffab80);
        AutoArray<Imf_3_4::(anonymous_namespace)::HufDec,_16384>::AutoArray
                  ((AutoArray<Imf_3_4::(anonymous_namespace)::HufDec,_16384> *)
                   in_stack_ffffffffffffab80);
        AutoArray::operator_cast_to_HufDec_(local_5428);
        anon_unknown_0::hufClearDecTable((HufDec *)0x1e01e4);
        local_30 = (int)pcVar5;
        local_8 = (int)in_RDI;
        im_00 = in_ESI + (local_8 - local_30);
        AutoArray::operator_cast_to_unsigned_long_(local_5420);
        anon_unknown_0::hufUnpackEncTable
                  ((char **)in_stack_ffffffffffffabb0,
                   (int)((ulong)in_stack_ffffffffffffaba8 >> 0x20),(int)in_stack_ffffffffffffaba8,
                   iM_00,(uint64_t *)CONCAT44(in_stack_ffffffffffffab9c,in_stack_ffffffffffffab98));
        if (((long)in_ESI - ((long)pcVar5 - (long)in_RDI)) * 8 < (long)(int)uVar4) {
          anon_unknown_0::invalidNBits();
        }
        AutoArray::operator_cast_to_unsigned_long_(local_5420);
        AutoArray::operator_cast_to_HufDec_(local_5428);
        anon_unknown_0::hufBuildDecTable
                  ((uint64_t *)CONCAT44(uVar3,uVar2),im_00,in_stack_ffffffffffffabb8,
                   in_stack_ffffffffffffabb0);
        AutoArray::operator_cast_to_unsigned_long_(local_5420);
        AutoArray::operator_cast_to_HufDec_(local_5428);
        anon_unknown_0::hufDecode
                  (in_stack_ffffffffffffac10,in_stack_ffffffffffffac08,in_stack_ffffffffffffac00,
                   in_stack_ffffffffffffabfc,in_stack_ffffffffffffabf8,in_stack_ffffffffffffabf4,
                   (unsigned_short *)CONCAT44(in_stack_ffffffffffffac24,in_stack_ffffffffffffac20));
        hdecod = AutoArray::operator_cast_to_HufDec_(local_5428);
        anon_unknown_0::hufFreeDecTable(hdecod);
        AutoArray<Imf_3_4::(anonymous_namespace)::HufDec,_16384>::~AutoArray
                  ((AutoArray<Imf_3_4::(anonymous_namespace)::HufDec,_16384> *)hdecod);
        AutoArray<unsigned_long,_65537>::~AutoArray((AutoArray<unsigned_long,_65537> *)hdecod);
      }
    }
  }
  return;
}

Assistant:

void
hufUncompress (
    const char compressed[], int nCompressed, unsigned short raw[], int nRaw)
{
    //
    // need at least 20 bytes for header
    //
    if (nCompressed < 20)
    {
        if (nRaw != 0) notEnoughData ();

        return;
    }

    int im = readUInt (compressed);
    int iM = readUInt (compressed + 4);
    // int tableLength = readUInt (compressed + 8);
    int nBits = readUInt (compressed + 12);

    if (im < 0 || im >= HUF_ENCSIZE || iM < 0 || iM >= HUF_ENCSIZE)
        invalidTableSize ();

    const char* ptr = compressed + 20;

    uint64_t nBytes = (static_cast<uint64_t> (nBits) + 7) / 8;

    if (ptr + nBytes > compressed + nCompressed)
    {
        notEnoughData ();
        return;
    }

    //
    // Fast decoder needs at least 2x64-bits of compressed data, and
    // needs to be run-able on this platform. Otherwise, fall back
    // to the original decoder
    //

    if (FastHufDecoder::enabled () && nBits > 128)
    {
        FastHufDecoder fhd (ptr, nCompressed - (ptr - compressed), im, iM, iM);

        // must be nBytes remaining in buffer
        if (ptr - compressed + nBytes > static_cast<uint64_t> (nCompressed))
        {
            notEnoughData ();
            return;
        }

        fhd.decode ((unsigned char*) ptr, nBits, raw, nRaw);
    }
    else
    {
        AutoArray<uint64_t, HUF_ENCSIZE> freq;
        AutoArray<HufDec, HUF_DECSIZE>   hdec;

        hufClearDecTable (hdec);

        hufUnpackEncTable (
            &ptr, nCompressed - (ptr - compressed), im, iM, freq);

        try
        {
            if (nBits > 8 * (nCompressed - (ptr - compressed))) invalidNBits ();

            hufBuildDecTable (freq, im, iM, hdec);
            hufDecode (freq, hdec, ptr, nBits, iM, nRaw, raw);
        }
        catch (...)
        {
            hufFreeDecTable (hdec);
            throw;
        }

        hufFreeDecTable (hdec);
    }
}